

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

ImGuiWindowSettings * __thiscall
ImChunkStream<ImGuiWindowSettings>::next_chunk
          (ImChunkStream<ImGuiWindowSettings> *this,ImGuiWindowSettings *p)

{
  int iVar1;
  ImGuiWindowSettings *pIVar2;
  bool bVar3;
  size_t HDR_SZ;
  ImGuiWindowSettings *p_local;
  ImChunkStream<ImGuiWindowSettings> *this_local;
  
  pIVar2 = begin(this);
  bVar3 = false;
  if (pIVar2 <= p) {
    pIVar2 = end(this);
    bVar3 = p < pIVar2;
  }
  if (bVar3) {
    iVar1 = chunk_size(this,p);
    this_local = (ImChunkStream<ImGuiWindowSettings> *)((long)&p->ID + (long)iVar1);
    pIVar2 = end(this);
    if ((ImVec2ih *)this_local == &pIVar2->Pos) {
      this_local = (ImChunkStream<ImGuiWindowSettings> *)0x0;
    }
    else {
      pIVar2 = end(this);
      if (pIVar2 <= this_local) {
        __assert_fail("p < end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_internal.h"
                      ,0x29f,
                      "T *ImChunkStream<ImGuiWindowSettings>::next_chunk(T *) [T = ImGuiWindowSettings]"
                     );
      }
    }
    return (ImGuiWindowSettings *)this_local;
  }
  __assert_fail("p >= begin() && p < end()",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_internal.h"
                ,0x29f,
                "T *ImChunkStream<ImGuiWindowSettings>::next_chunk(T *) [T = ImGuiWindowSettings]");
}

Assistant:

T*      next_chunk(T* p)            { size_t HDR_SZ = 4; IM_ASSERT(p >= begin() && p < end()); p = (T*)(void*)((char*)(void*)p + chunk_size(p)); if (p == (T*)(void*)((char*)end() + HDR_SZ)) return (T*)0; IM_ASSERT(p < end()); return p; }